

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_win_part(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  ggml_tensor *src0;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int64_t i00;
  long lVar15;
  long lVar16;
  int64_t i02;
  long lVar17;
  long lVar18;
  undefined4 uVar19;
  long local_e0;
  long local_d8;
  long local_d0;
  ulong local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  
  pgVar3 = dst->src[0];
  if (pgVar3->type == GGML_TYPE_F32) {
    iVar1 = dst->op_params[1];
    if (0 < (long)iVar1) {
      lVar4 = pgVar3->ne[0];
      lVar5 = pgVar3->ne[1];
      lVar6 = pgVar3->ne[2];
      lVar7 = dst->ne[0];
      lVar8 = dst->ne[1];
      lVar9 = dst->ne[2];
      uVar2 = dst->op_params[0];
      lVar11 = (long)dst->op_params[2];
      lVar12 = lVar8 * lVar7 * lVar9;
      lVar14 = lVar5 * lVar4;
      local_d0 = 0;
      local_d8 = 0;
      local_e0 = 0;
      do {
        if (0 < (int)uVar2) {
          local_b8 = local_d0;
          local_c0 = local_d8;
          local_c8 = 0;
          do {
            if (0 < lVar9) {
              local_a8 = local_b8;
              local_b0 = local_c0;
              lVar18 = 0;
              do {
                if (0 < lVar8) {
                  lVar16 = 0;
                  lVar13 = local_b0;
                  lVar17 = local_a8;
                  do {
                    if (0 < lVar7) {
                      pvVar10 = dst->data;
                      lVar15 = 0;
                      do {
                        uVar19 = 0;
                        if ((long)(lVar16 + local_c8 * lVar11) < lVar5 &&
                            lVar18 + local_e0 * lVar11 < lVar6) {
                          uVar19 = *(undefined4 *)((long)pgVar3->data + lVar15 * 4 + lVar17);
                        }
                        *(undefined4 *)((long)pvVar10 + lVar15 * 4 + lVar13) = uVar19;
                        lVar15 = lVar15 + 1;
                      } while (lVar7 != lVar15);
                    }
                    lVar16 = lVar16 + 1;
                    lVar13 = lVar13 + lVar7 * 4;
                    lVar17 = lVar17 + lVar4 * 4;
                  } while (lVar16 != lVar8);
                }
                lVar18 = lVar18 + 1;
                local_b0 = local_b0 + lVar8 * lVar7 * 4;
                local_a8 = local_a8 + lVar14 * 4;
              } while (lVar18 != lVar9);
            }
            local_c8 = local_c8 + 1;
            local_c0 = local_c0 + lVar12 * 4;
            local_b8 = local_b8 + lVar4 * lVar11 * 4;
          } while (local_c8 != uVar2);
        }
        local_e0 = local_e0 + 1;
        local_d8 = local_d8 + (int)uVar2 * lVar12 * 4;
        local_d0 = local_d0 + lVar14 * lVar11 * 4;
      } while (local_e0 != iVar1);
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x1de6,"fatal error");
}

Assistant:

void ggml_compute_forward_win_part(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_win_part_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}